

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

void __thiscall calculator::Lexer::scan(Lexer *this)

{
  shared_ptr<calculator::Token> *this_00;
  bool bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ZeroNumberException *this_01;
  HexBinOctException *pHVar6;
  long lVar7;
  Number *pNVar8;
  SyntaxError *pSVar9;
  Float *pFVar10;
  Function *this_02;
  BinaryFunction *this_03;
  FunctionNotDefined *this_04;
  Word *this_05;
  mapped_type *this_06;
  pointer ppVar11;
  pointer ppVar12;
  __shared_ptr_access<calculator::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_07;
  element_type *peVar13;
  Token *pTVar14;
  reference pvVar15;
  double dVar16;
  shared_ptr<calculator::Token> local_4b8;
  shared_ptr<calculator::Token> local_4a8;
  shared_ptr<calculator::Token> local_498;
  byte local_483;
  undefined1 local_482;
  allocator<char> local_481;
  undefined1 local_480 [5];
  bool isEndOfFunction;
  shared_ptr<calculator::Token> local_460;
  value_type local_449;
  shared_ptr<calculator::Token> local_448;
  value_type local_431;
  shared_ptr<calculator::Token> local_430;
  shared_ptr<calculator::Token> local_420;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
  local_410;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
  local_408;
  iterator x;
  shared_ptr<calculator::Token> local_3f0;
  undefined1 local_3e0 [8];
  shared_ptr<calculator::Token> word;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
  local_3c8;
  iterator it;
  shared_ptr<calculator::Token> local_3b0;
  undefined1 local_3a0 [8];
  string b;
  allocator<char> local_369;
  string local_368;
  undefined4 local_344;
  shared_ptr<calculator::Token> local_340;
  undefined1 local_32a;
  allocator<char> local_329;
  string local_328;
  undefined1 local_302;
  allocator<char> local_301;
  string local_300;
  byte local_2da;
  byte local_2d9;
  undefined1 local_2d8 [6];
  bool once_exponent;
  bool once_add_sub;
  string s;
  shared_ptr<calculator::Number> local_2a8;
  shared_ptr<calculator::Number> local_298;
  undefined1 local_282;
  allocator<char> local_281;
  string local_280;
  shared_ptr<calculator::Number> local_260;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  shared_ptr<calculator::Number> local_228;
  undefined1 local_212;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  shared_ptr<calculator::Number> num;
  string str;
  string local_1b8;
  shared_ptr<calculator::Token> local_198;
  type_conflict2 *local_188;
  type_conflict2 *c_3;
  type_conflict1 *ok_2;
  string local_170;
  shared_ptr<calculator::Token> local_150;
  type_conflict2 *local_140;
  type_conflict2 *c_2;
  type_conflict1 *ok_1;
  shared_ptr<calculator::Token> local_128;
  shared_ptr<calculator::Token> local_118;
  shared_ptr<calculator::Token> local_108;
  shared_ptr<calculator::Token> local_f8;
  shared_ptr<calculator::Token> local_e8;
  type_conflict2 *local_d8;
  type_conflict2 *c_1;
  type_conflict1 *ok;
  shared_ptr<calculator::Token> local_c0;
  shared_ptr<calculator::Token> local_b0;
  shared_ptr<calculator::Token> local_a0;
  shared_ptr<calculator::Token> local_90;
  shared_ptr<calculator::Token> local_80;
  shared_ptr<calculator::Token> local_70;
  shared_ptr<calculator::Token> local_60;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  char local_13;
  byte local_12;
  char local_11;
  char nc;
  bool minus;
  Lexer *pLStack_10;
  char c;
  Lexer *this_local;
  
  local_12 = 0;
  pLStack_10 = this;
  while (bVar1 = Reader::eof(&this->reader_), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_11 = Reader::get(&this->reader_);
    if (local_11 == -1) {
      return;
    }
    uVar4 = isspace((int)local_11);
    if ((uVar4 & 1) == 0) {
      bVar1 = isnewline_(local_11);
      if (!bVar1) {
        if ((local_11 == '+') || (local_11 == '-')) {
          do {
            local_13 = Reader::get(&this->reader_);
            uVar4 = isspace((int)local_13);
          } while ((uVar4 & 1) != 0);
          if (local_11 == local_13) {
            local_4d = 1;
            pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_38,"can not present continue symbol ++/--",&local_39);
            SyntaxError::SyntaxError(pSVar9,&local_38);
            local_4d = 0;
            __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          Reader::back(&this->reader_);
        }
        break;
      }
      this->line_ = this->line_ + 1;
    }
  }
  if ((((this->lookforward_ != ')') && (bVar1 = isexponent(this->lookforward_), !bVar1)) &&
      ((local_11 == '-' || (local_11 == '+')))) &&
     (((uVar4 = isdigit((int)this->lookforward_), (uVar4 & 1) == 0 &&
       (bVar1 = isletter(this->lookforward_), !bVar1)) && (this->lookforward_ != '.')))) {
    if (local_11 == '-') {
      local_12 = 1;
    }
    local_11 = Reader::get(&this->reader_);
    while (uVar4 = isspace((int)local_11), (uVar4 & 1) != 0) {
      local_11 = Reader::get(&this->reader_);
    }
  }
  this->lookforward_ = local_11;
  switch(local_11) {
  case '!':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Not);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_80,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_80);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_80);
    break;
  default:
    goto LAB_0011a80b;
  case '%':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Mod);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_128,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_128);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_128);
    break;
  case '&':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,And);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_60,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_60);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_60);
    break;
  case '*':
    ok._6_2_ = Reader::geteq(&this->reader_,0x2a);
    c_1 = std::get<0ul,bool,char>((pair<bool,_char> *)((long)&ok + 6));
    local_d8 = std::get<1ul,bool,char>((pair<bool,_char> *)((long)&ok + 6));
    if ((*c_1 & 1U) == 0) {
      pTVar14 = (Token *)operator_new(0x48);
      Token::Token(pTVar14,Mul);
      std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_f8,pTVar14);
      std::
      vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
      ::push_back(&this->tokenlist_,&local_f8);
      std::shared_ptr<calculator::Token>::~shared_ptr(&local_f8);
    }
    else {
      pTVar14 = (Token *)operator_new(0x48);
      Token::Token(pTVar14,Pow);
      std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_e8,pTVar14);
      std::
      vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
      ::push_back(&this->tokenlist_,&local_e8);
      std::shared_ptr<calculator::Token>::~shared_ptr(&local_e8);
    }
    break;
  case '+':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Add);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_b0,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_b0);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_b0);
    break;
  case '-':
    if ((local_12 & 1) == 0) {
      pTVar14 = (Token *)operator_new(0x48);
      Token::Token(pTVar14,Sub);
      std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_c0,pTVar14);
      std::
      vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
      ::push_back(&this->tokenlist_,&local_c0);
      std::shared_ptr<calculator::Token>::~shared_ptr(&local_c0);
      return;
    }
LAB_0011a80b:
    if ((local_11 == '0') && (cVar2 = Reader::peek(&this->reader_), cVar2 != '.')) {
      cVar2 = Reader::peek(&this->reader_);
      uVar4 = isdigit((int)cVar2);
      if ((uVar4 & 1) != 0) {
        this_01 = (ZeroNumberException *)__cxa_allocate_exception(0x28);
        cVar2 = Reader::peek(&this->reader_);
        ZeroNumberException::ZeroNumberException(this_01,cVar2 + -0x30);
        __cxa_throw(this_01,&ZeroNumberException::typeinfo,ZeroNumberException::~ZeroNumberException
                   );
      }
      local_11 = Reader::get(&this->reader_);
      std::__cxx11::string::string
                ((string *)
                 &num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::shared_ptr<calculator::Number>::shared_ptr
                ((shared_ptr<calculator::Number> *)local_1f0,(nullptr_t)0x0);
      if (local_11 == 'b') {
        local_11 = Reader::get(&this->reader_);
        while (bVar1 = isbin(local_11), bVar1) {
          std::__cxx11::string::append
                    ((ulong)&num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,'\x01');
          local_11 = Reader::get(&this->reader_);
        }
        uVar4 = isdigit((int)local_11);
        if (((((uVar4 & 1) != 0) && ('1' < local_11)) && (local_11 < ':')) ||
           (bVar1 = isletter(local_11), bVar1)) {
          local_282 = 1;
          pHVar6 = (HexBinOctException *)__cxa_allocate_exception(0x28);
          cVar2 = local_11;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,1,cVar2,&local_281);
          HexBinOctException::HexBinOctException(pHVar6,&local_280);
          local_282 = 0;
          __cxa_throw(pHVar6,&HexBinOctException::typeinfo,HexBinOctException::~HexBinOctException);
        }
        pNVar8 = (Number *)operator_new(0x50);
        lVar7 = toBase<long,2ul>((string *)
                                 &num.
                                  super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        Number::Number(pNVar8,lVar7);
        std::shared_ptr<calculator::Number>::shared_ptr<calculator::Number,void>(&local_298,pNVar8);
        std::shared_ptr<calculator::Number>::operator=
                  ((shared_ptr<calculator::Number> *)local_1f0,&local_298);
        std::shared_ptr<calculator::Number>::~shared_ptr(&local_298);
      }
      else if (local_11 == 'o') {
        local_11 = Reader::get(&this->reader_);
        while (bVar1 = isoct(local_11), bVar1) {
          std::__cxx11::string::append
                    ((ulong)&num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,'\x01');
          local_11 = Reader::get(&this->reader_);
        }
        uVar4 = isdigit((int)local_11);
        if (((((uVar4 & 1) != 0) && ('7' < local_11)) && (local_11 < ':')) ||
           (bVar1 = isletter(local_11), bVar1)) {
          local_24a = 1;
          pHVar6 = (HexBinOctException *)__cxa_allocate_exception(0x28);
          cVar2 = local_11;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,1,cVar2,&local_249);
          HexBinOctException::HexBinOctException(pHVar6,&local_248);
          local_24a = 0;
          __cxa_throw(pHVar6,&HexBinOctException::typeinfo,HexBinOctException::~HexBinOctException);
        }
        pNVar8 = (Number *)operator_new(0x50);
        lVar7 = toBase<long,8ul>((string *)
                                 &num.
                                  super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        Number::Number(pNVar8,lVar7);
        std::shared_ptr<calculator::Number>::shared_ptr<calculator::Number,void>(&local_260,pNVar8);
        std::shared_ptr<calculator::Number>::operator=
                  ((shared_ptr<calculator::Number> *)local_1f0,&local_260);
        std::shared_ptr<calculator::Number>::~shared_ptr(&local_260);
      }
      else if (local_11 == 'x') {
        local_11 = Reader::get(&this->reader_);
        while (bVar1 = ishex(local_11), bVar1) {
          std::__cxx11::string::append
                    ((ulong)&num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,'\x01');
          local_11 = Reader::get(&this->reader_);
        }
        bVar1 = isletter(local_11);
        if ((bVar1) && (('f' < local_11 || ('F' < local_11)))) {
          local_212 = 1;
          pHVar6 = (HexBinOctException *)__cxa_allocate_exception(0x28);
          cVar2 = local_11;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,1,cVar2,&local_211);
          HexBinOctException::HexBinOctException(pHVar6,&local_210);
          local_212 = 0;
          __cxa_throw(pHVar6,&HexBinOctException::typeinfo,HexBinOctException::~HexBinOctException);
        }
        pNVar8 = (Number *)operator_new(0x50);
        lVar7 = toBase<long,16ul>((string *)
                                  &num.
                                   super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
        Number::Number(pNVar8,lVar7);
        std::shared_ptr<calculator::Number>::shared_ptr<calculator::Number,void>(&local_228,pNVar8);
        std::shared_ptr<calculator::Number>::operator=
                  ((shared_ptr<calculator::Number> *)local_1f0,&local_228);
        std::shared_ptr<calculator::Number>::~shared_ptr(&local_228);
      }
      else {
        pNVar8 = (Number *)operator_new(0x50);
        Number::Number(pNVar8,0);
        std::shared_ptr<calculator::Number>::shared_ptr<calculator::Number,void>(&local_2a8,pNVar8);
        std::shared_ptr<calculator::Number>::operator=
                  ((shared_ptr<calculator::Number> *)local_1f0,&local_2a8);
        std::shared_ptr<calculator::Number>::~shared_ptr(&local_2a8);
      }
      Reader::back(&this->reader_);
      this_00 = (shared_ptr<calculator::Token> *)((long)&s.field_2 + 8);
      std::shared_ptr<calculator::Token>::shared_ptr<calculator::Number,void>
                (this_00,(shared_ptr<calculator::Number> *)local_1f0);
      std::
      vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
      ::push_back(&this->tokenlist_,this_00);
      std::shared_ptr<calculator::Token>::~shared_ptr
                ((shared_ptr<calculator::Token> *)((long)&s.field_2 + 8));
      std::shared_ptr<calculator::Number>::~shared_ptr((shared_ptr<calculator::Number> *)local_1f0);
      std::__cxx11::string::~string
                ((string *)
                 &num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    else {
      uVar4 = isdigit((int)local_11);
      if (((uVar4 & 1) != 0) || (local_11 == '.')) {
        std::__cxx11::string::string((string *)local_2d8);
        local_2d9 = 0;
        local_2da = 0;
        if ((local_12 & 1) != 0) {
          std::__cxx11::string::operator+=((string *)local_2d8,'-');
        }
        if (local_11 != '.') {
          do {
            bVar1 = isexponent(local_11);
            if (bVar1) {
              if ((local_2da & 1) != 0) {
                local_302 = 1;
                pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_300,"expoent e/E is to many!",&local_301);
                SyntaxError::SyntaxError(pSVar9,&local_300);
                local_302 = 0;
                __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
              }
              local_2da = 1;
            }
            if ((local_11 == '-') || (local_11 == '+')) {
              cVar2 = Reader::backc(&this->reader_);
              bVar1 = isexponent(cVar2);
              if (bVar1) {
                local_2d9 = 1;
                goto LAB_0011b60b;
              }
              break;
            }
            std::__cxx11::string::append((ulong)local_2d8,'\x01');
            local_11 = Reader::get(&this->reader_);
            uVar4 = isdigit((int)local_11);
            bVar1 = true;
            if ((uVar4 & 1) == 0) {
              bVar3 = isexponent(local_11);
              bVar1 = true;
              if ((!bVar3) && (bVar1 = true, local_11 != '-')) {
                bVar1 = local_11 == '+';
              }
            }
          } while (bVar1);
          if (local_11 != '.') {
            if ((local_11 == -1) && ((local_2da & 1) != 0)) {
              cVar2 = Reader::backc(&this->reader_);
              uVar4 = isdigit((int)cVar2);
              if ((uVar4 & 1) == 0) {
                local_32a = 1;
                pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_328,"after digit e/E errro",&local_329);
                SyntaxError::SyntaxError(pSVar9,&local_328);
                local_32a = 0;
                __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
              }
            }
            Reader::back(&this->reader_);
            cVar2 = Reader::cur(&this->reader_);
            this->lookforward_ = cVar2;
            pNVar8 = (Number *)operator_new(0x50);
            dVar16 = toAny<double>((string *)local_2d8);
            Number::Number(pNVar8,(long)dVar16);
            std::shared_ptr<calculator::Token>::shared_ptr<calculator::Number,void>
                      (&local_340,pNVar8);
            std::
            vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
            ::push_back(&this->tokenlist_,&local_340);
            std::shared_ptr<calculator::Token>::~shared_ptr(&local_340);
LAB_0011b928:
            local_344 = 1;
            std::__cxx11::string::~string((string *)local_2d8);
            return;
          }
        }
LAB_0011b60b:
        std::__cxx11::string::append((ulong)local_2d8,'\x01');
        do {
          local_11 = Reader::get(&this->reader_);
          bVar1 = isexponent(local_11);
          if (bVar1) {
            if ((local_2da & 1) != 0) {
              pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_368,"expoent e/E is to many!",&local_369);
              SyntaxError::SyntaxError(pSVar9,&local_368);
              __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
            }
            local_2da = 1;
          }
          if ((local_11 == '+') || (local_11 == '-')) {
            if ((local_2d9 & 1) != 0) goto LAB_0011b81e;
            local_2d9 = 1;
            cVar2 = Reader::backc(&this->reader_);
            bVar1 = isexponent(cVar2);
            if (!bVar1) goto LAB_0011b81e;
          }
          uVar4 = isdigit((int)local_11);
          if (((((uVar4 & 1) == 0) && (bVar1 = isexponent(local_11), !bVar1)) && (local_11 != '+'))
             && (local_11 != '-')) goto LAB_0011b81e;
          std::__cxx11::string::append((ulong)local_2d8,'\x01');
        } while( true );
      }
      bVar1 = isletter(local_11);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_3a0);
        do {
          std::__cxx11::string::append((ulong)local_3a0,'\x01');
          local_11 = Reader::get(&this->reader_);
          bVar1 = isletter(local_11);
        } while (bVar1);
        while (uVar4 = isdigit((int)local_11), (uVar4 & 1) != 0) {
          std::__cxx11::string::append((ulong)local_3a0,'\x01');
          local_11 = Reader::get(&this->reader_);
        }
        if (local_11 == '(') {
          bVar1 = isUnaryFunction(this,(string *)local_3a0);
          if (bVar1) {
            Reader::back(&this->reader_);
            this->is_function_ = true;
            this_02 = (Function *)operator_new(0x70);
            Function::Function(this_02,(string *)local_3a0,(bool)(local_12 & 1));
            std::shared_ptr<calculator::Token>::shared_ptr<calculator::Function,void>
                      (&local_3b0,this_02);
            std::
            vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
            ::push_back(&this->tokenlist_,&local_3b0);
            std::shared_ptr<calculator::Token>::~shared_ptr(&local_3b0);
            local_344 = 1;
          }
          else {
            bVar1 = isBinaryFunction(this,(string *)local_3a0);
            if (!bVar1) {
              this_04 = (FunctionNotDefined *)__cxa_allocate_exception(0x28);
              FunctionNotDefined::FunctionNotDefined(this_04,(string *)local_3a0);
              __cxa_throw(this_04,&FunctionNotDefined::typeinfo,
                          FunctionNotDefined::~FunctionNotDefined);
            }
            Reader::back(&this->reader_);
            this->is_function_ = true;
            this_03 = (BinaryFunction *)operator_new(0x70);
            BinaryFunction::BinaryFunction(this_03,(string *)local_3a0,(bool)(local_12 & 1));
            std::shared_ptr<calculator::Token>::shared_ptr<calculator::BinaryFunction,void>
                      ((shared_ptr<calculator::Token> *)&it,this_03);
            std::
            vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
            ::push_back(&this->tokenlist_,(value_type *)&it);
            std::shared_ptr<calculator::Token>::~shared_ptr((shared_ptr<calculator::Token> *)&it);
            local_344 = 1;
          }
        }
        else {
          Reader::back(&this->reader_);
          local_3c8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>_>
               ::find(&this->variable,(key_type *)local_3a0);
          word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>_>
               ::end(&this->variable);
          bVar1 = std::__detail::operator==
                            (&local_3c8,
                             (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                              *)&word.
                                 super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
          if (bVar1) {
            this_05 = (Word *)operator_new(0x70);
            Word::Word(this_05,(string *)local_3a0,(bool)(local_12 & 1),Identifier);
            std::shared_ptr<calculator::Token>::shared_ptr<calculator::Word,void>
                      ((shared_ptr<calculator::Token> *)local_3e0,this_05);
            this_06 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>_>
                      ::operator[](&this->variable,(key_type *)local_3a0);
            std::shared_ptr<calculator::Token>::operator=
                      (this_06,(shared_ptr<calculator::Token> *)local_3e0);
            std::
            vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
            ::push_back(&this->tokenlist_,(shared_ptr<calculator::Token> *)local_3e0);
            local_344 = 1;
            std::shared_ptr<calculator::Token>::~shared_ptr
                      ((shared_ptr<calculator::Token> *)local_3e0);
          }
          else {
            if ((local_12 & 1) != 0) {
              pNVar8 = (Number *)operator_new(0x50);
              Number::Number(pNVar8,-1);
              std::shared_ptr<calculator::Token>::shared_ptr<calculator::Number,void>
                        (&local_3f0,pNVar8);
              std::
              vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
              ::push_back(&this->tokenlist_,&local_3f0);
              std::shared_ptr<calculator::Token>::~shared_ptr(&local_3f0);
              pTVar14 = (Token *)operator_new(0x48);
              Token::Token(pTVar14,Mul);
              std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>
                        ((shared_ptr<calculator::Token> *)&x,pTVar14);
              std::
              vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
              ::push_back(&this->tokenlist_,(value_type *)&x);
              std::shared_ptr<calculator::Token>::~shared_ptr((shared_ptr<calculator::Token> *)&x);
            }
            ppVar11 = std::__detail::
                      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_false,_true>
                      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_false,_true>
                                    *)&local_3c8);
            local_408._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::find(&this->constant,&ppVar11->first);
            local_410._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::end(&this->constant);
            bVar1 = std::__detail::operator!=(&local_408,&local_410);
            if (bVar1) {
              pFVar10 = (Float *)operator_new(0x50);
              ppVar12 = std::__detail::
                        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>
                        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>
                                      *)&local_408);
              Float::Float(pFVar10,ppVar12->second);
              std::shared_ptr<calculator::Token>::shared_ptr<calculator::Float,void>
                        (&local_420,pFVar10);
              std::
              vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
              ::push_back(&this->tokenlist_,&local_420);
              std::shared_ptr<calculator::Token>::~shared_ptr(&local_420);
              local_344 = 1;
            }
            else {
              ppVar11 = std::__detail::
                        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_false,_true>
                        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_false,_true>
                                      *)&local_3c8);
              std::
              vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
              ::push_back(&this->tokenlist_,&ppVar11->second);
              local_344 = 1;
            }
          }
        }
        std::__cxx11::string::~string((string *)local_3a0);
      }
      else if (local_11 == ';') {
        bVar1 = std::
                vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
                ::empty(&this->tokenlist_);
        if (!bVar1) {
          this_07 = (__shared_ptr_access<calculator::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
                       ::back(&this->tokenlist_);
          peVar13 = std::
                    __shared_ptr_access<calculator::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(this_07);
          iVar5 = (*peVar13->_vptr_Token[2])();
          if (iVar5 == 0x13) {
            return;
          }
        }
        pTVar14 = (Token *)operator_new(0x48);
        Token::Token(pTVar14,END_SEP);
        std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_430,pTVar14);
        std::
        vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
        ::push_back(&this->tokenlist_,&local_430);
        std::shared_ptr<calculator::Token>::~shared_ptr(&local_430);
      }
      else if (local_11 == '(') {
        if ((this->is_function_ & 1U) == 0) {
          local_449 = false;
          std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                    (&this->bracket_match_,&local_449);
          this->is_function_ = false;
          pTVar14 = (Token *)operator_new(0x48);
          Token::Token(pTVar14,BEGIN_BRACKET);
          std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_460,pTVar14)
          ;
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,&local_460);
          std::shared_ptr<calculator::Token>::~shared_ptr(&local_460);
        }
        else {
          local_431 = true;
          std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                    (&this->bracket_match_,&local_431);
          this->is_function_ = false;
          pTVar14 = (Token *)operator_new(0x48);
          Token::Token(pTVar14,BEGIN_FUNC);
          std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_448,pTVar14)
          ;
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,&local_448);
          std::shared_ptr<calculator::Token>::~shared_ptr(&local_448);
        }
      }
      else if (local_11 == ')') {
        bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty
                          (&this->bracket_match_);
        if (bVar1) {
          local_482 = 1;
          pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_480,"expression unexpected (!",&local_481);
          SyntaxError::SyntaxError(pSVar9,(string *)local_480);
          local_482 = 0;
          __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        pvVar15 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top
                            (&this->bracket_match_);
        local_483 = *pvVar15 & 1;
        std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&this->bracket_match_);
        if ((local_483 & 1) == 0) {
          this->is_function_ = false;
          pTVar14 = (Token *)operator_new(0x48);
          Token::Token(pTVar14,END_BRACKET);
          std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_4a8,pTVar14)
          ;
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,&local_4a8);
          std::shared_ptr<calculator::Token>::~shared_ptr(&local_4a8);
        }
        else {
          this->is_function_ = false;
          pTVar14 = (Token *)operator_new(0x48);
          Token::Token(pTVar14,END_FUNC);
          std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_498,pTVar14)
          ;
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,&local_498);
          std::shared_ptr<calculator::Token>::~shared_ptr(&local_498);
        }
      }
      else {
        pTVar14 = (Token *)operator_new(0x48);
        Token::Token(pTVar14,local_11);
        std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_4b8,pTVar14);
        std::
        vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
        ::push_back(&this->tokenlist_,&local_4b8);
        std::shared_ptr<calculator::Token>::~shared_ptr(&local_4b8);
      }
    }
    break;
  case '/':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Div);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_108,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_108);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_108);
    break;
  case '<':
    ok_1._6_2_ = Reader::geteq(&this->reader_,0x3c);
    c_2 = std::get<0ul,bool,char>((pair<bool,_char> *)((long)&ok_1 + 6));
    local_140 = std::get<1ul,bool,char>((pair<bool,_char> *)((long)&ok_1 + 6));
    if ((*c_2 & 1U) == 0) {
      ok_2._6_1_ = 1;
      pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"unexpected <?",(allocator<char> *)((long)&ok_2 + 7));
      SyntaxError::SyntaxError(pSVar9,&local_170);
      ok_2._6_1_ = 0;
      __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,ShiftLeft);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_150,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_150);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_150);
    break;
  case '=':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Equal);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_118,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_118);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_118);
    break;
  case '>':
    ok_2._4_2_ = Reader::geteq(&this->reader_,0x3e);
    c_3 = std::get<0ul,bool,char>((pair<bool,_char> *)((long)&ok_2 + 4));
    local_188 = std::get<1ul,bool,char>((pair<bool,_char> *)((long)&ok_2 + 4));
    if ((*c_3 & 1U) == 0) {
      str.field_2._M_local_buf[0xe] = '\x01';
      pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"unexpected >?",
                 (allocator<char> *)(str.field_2._M_local_buf + 0xf));
      SyntaxError::SyntaxError(pSVar9,&local_1b8);
      str.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pSVar9,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,ShiftRight);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_198,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_198);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_198);
    break;
  case '^':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Xor);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_90,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_90);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_90);
    break;
  case '|':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Or);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_70,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_70);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_70);
    break;
  case '~':
    pTVar14 = (Token *)operator_new(0x48);
    Token::Token(pTVar14,Negate);
    std::shared_ptr<calculator::Token>::shared_ptr<calculator::Token,void>(&local_a0,pTVar14);
    std::
    vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
    ::push_back(&this->tokenlist_,&local_a0);
    std::shared_ptr<calculator::Token>::~shared_ptr(&local_a0);
  }
  return;
LAB_0011b81e:
  Reader::back(&this->reader_);
  cVar2 = Reader::cur(&this->reader_);
  this->lookforward_ = cVar2;
  pFVar10 = (Float *)operator_new(0x50);
  dVar16 = toAny<double>((string *)local_2d8);
  Float::Float(pFVar10,dVar16);
  std::shared_ptr<calculator::Token>::shared_ptr<calculator::Float,void>
            ((shared_ptr<calculator::Token> *)((long)&b.field_2 + 8),pFVar10);
  std::
  vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>::
  push_back(&this->tokenlist_,(value_type *)((long)&b.field_2 + 8));
  std::shared_ptr<calculator::Token>::~shared_ptr
            ((shared_ptr<calculator::Token> *)((long)&b.field_2 + 8));
  goto LAB_0011b928;
}

Assistant:

void Lexer::scan() {
    char c;
    // 标志是否为负数
    bool minus = false;
    // 跳过空白字符
    while (!reader_.eof()) {
        c = reader_.get();
        if (c == EOF) return;
        if (isspace(c))
            continue;
        else if (isnewline_(c))
            line_++;
        else if (c == '+' || c == '-') {
            char nc;
            // 判断是否出现多个连续的 +-符号
            while (isspace((nc = reader_.get())))
                ;
            if (c == nc) {
                throw SyntaxError("can not present continue symbol ++/--");
            } else {
                reader_.back();
                break;
            }
        } else
            break;
    }

    // )+   )- 向前看字符如果是 ) 说明当前的 +/- 一定是一个 减法或加法
    if (lookforward_ != ')' && !isexponent(lookforward_) &&
        (c == '-' || c == '+')) {
        // +100 / -100  0.+100
        // 对于表达式 1 + -100 和 1. - 100 可以识别出来
        if (!isdigit(lookforward_) && !isletter(lookforward_) &&
            lookforward_ != '.') {
            if (c == '-') minus = true;
            c = reader_.get();
            while (isspace(c)) c = reader_.get();
        }
    }
    // 保存前一个字符
    lookforward_ = c;

    switch (c) {
        case '&':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::And)));
        case '|':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Or)));
        case '!':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Not)));
        case '^':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Xor)));
        case '~':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Negate)));
        case '+':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Add)));
        case '-': {
            // -表示一个负数，而非减法
            if (minus) break;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Sub)));
        }
        case '*': {
            if (auto [ok, c] = reader_.geteq('*'); ok) {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Pow)));
            } else {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Mul)));
            }
        }
        case '/':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Div)));
        case '=':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Equal)));
        case '%':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Mod)));
        case '<': {
            // <<左移
            if (auto [ok, c] = reader_.geteq('<'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftLeft)));
            else
                throw SyntaxError("unexpected <?");
        } break;
        case '>': {
            // >>右移
            if (auto [ok, c] = reader_.geteq('>'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftRight)));
            else
                throw SyntaxError("unexpected >?");
        }
        default:
            break;
    }
    /*
     * 处理进制数
     * 十六进制: 0xabcdef
     * 八进制:  0o1234567
     * 二进制:  0b1010101
     */
    if (c == '0') {
        // 处理小数
        if (reader_.peek() == '.') goto __integer_float_number_state;
        // 整数第一个数不能为0
        if (isdigit(reader_.peek()))
            throw ZeroNumberException(reader_.peek() - '0');

        c = reader_.get();
        std::string str;
        // 将非十进制的数字转化为十进制整数
        std::shared_ptr<Number> num = nullptr;

        // 判断下一个字符是否表示进制
        switch (c) {
            case 'x': {
                c = reader_.get();
                while (ishex(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if (isletter(c) && (c > 'f' || c > 'F'))
                    throw HexBinOctException(std::string(1, c));

                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 16>(str)));
            } break;
            case 'o': {
                c = reader_.get();
                while (isoct(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '7' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 8>(str)));
            } break;
            case 'b':
                c = reader_.get();
                while (isbin(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '1' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 2>(str)));
                break;
            default:
                // 单独的整数0
                num = std::shared_ptr<Number>(new Number(0));
        }
        // 回退一个字符
        reader_.back();
        return tokenlist_.push_back(num);
    }

__integer_float_number_state:
    // 整数或浮点数
    if (isdigit(c) || c == '.') {
        std::string s;
        bool once_add_sub = false, once_exponent = false;
        if (minus) s += '-';
        if (c == '.') goto __float_state;
        do {
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            // e/E+/-/数字
            if (c == '-' || c == '+') {
                // 只能出现一次e/E+/-
                if (isexponent(reader_.backc())) {
                    once_add_sub = true;
                    goto __float_state;
                } else
                    break;
            }
            s.append(1, c);
            c = reader_.get();
        } while (isdigit(c) || isexponent(c) || c == '-' || c == '+');
        if (c != '.') {
            // 读取到最后一个字符，但是数字后面存在一个E
            if (c == EOF) {
                if (once_exponent && !isdigit(reader_.backc()))
                    throw SyntaxError("after digit e/E errro");
            }
            reader_.back();
            lookforward_ = reader_.cur();
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Number(toAny<double>(s))));
        }
    __float_state:
        // 添加小数点
        s.append(1, c);
        for (;;) {
            c = reader_.get();
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            if (c == '+' || c == '-') {
                // 再次出现 +/- 时就表示加减法
                if (once_add_sub) break;
                once_add_sub = true;
                // 只能在e/E后面出现一次+/-
                if (!isexponent(reader_.backc())) break;
            }
            if (!isdigit(c) && !isexponent(c) && c != '+' && c != '-') break;
            s.append(1, c);
        }
        reader_.back();
        lookforward_ = reader_.cur();
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Float(toAny<double>(s))));
    }
    // 变量名/函数名 可以是字母和数字的组合
    if (isletter(c)) {
        std::string b;
        // 字母
        do {
            b.append(1, c);
            c = reader_.get();
        } while (isletter(c));
        // 数字
        while (isdigit(c)) {
            b.append(1, c);
            c = reader_.get();
        }
        // 如果变量名表示的是一个函数名(查表)
        if (c == '(') {
            if (isUnaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Function(b, minus)));
            } else if (isBinaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new BinaryFunction(b, minus)));
            } else
                throw FunctionNotDefined(b);
        } else {
            // 回退一个位置，因为还需要将 (
            // 作为token保存下来(目的是后续判断当前变量名是否是一个函数名)
            reader_.back();
            // 变量名不存在，则保存到变量表中。注意，函数名不需要保存到表中！！！
            if (auto it = variable.find(b); it == variable.end()) {
                auto word = std::shared_ptr<Token>(new Word(b, minus));
                variable[b] = word;
                return tokenlist_.push_back(word);
            } else {
                // 变量/常量附带一个负号标志
                // 比如 a=100;b=-a / -pi
                // 这里处理方法是将 -a 看作 -1 * a
                if (minus) {
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Number(-1)));
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Token(Tag::Mul)));
                }
                // 如果变量存在常量表中，那么就直接将这个变量替换为对应的常量值
                if (auto x = constant.find(it->first); x != constant.end()) {
                    return tokenlist_.push_back(
                        std::shared_ptr<Token>(new Float(x->second)));
                }
                // 否则直接返回表中变量名
                return tokenlist_.push_back(it->second);
            }
        }
        // 变量声明的分隔符;
    } else if (c == ';') {
        // ; ; 过滤多个连续的分隔符
        if (!tokenlist_.empty() && tokenlist_.back()->type() == Tag::END_SEP)
            return;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_SEP)));

    } else if (c == '(') {
        // 函数的开始标志符 (
        if (is_function_) {
            bracket_match_.push(true);
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::BEGIN_FUNC)));
        }
        // 普通的左括号
        bracket_match_.push(false);
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::BEGIN_BRACKET)));

    } else if (c == ')') {
        // 如果栈为空，说明括号不匹配
        if (bracket_match_.empty())
            throw SyntaxError("expression unexpected (!");

        // 函数的结尾标识符 )
        bool isEndOfFunction = bracket_match_.top();
        bracket_match_.pop();
        if (isEndOfFunction) {
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::END_FUNC)));
        }
        // 普通的右括号
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_BRACKET)));
    }
    // 根据其字符来指定其token，比如二元函数的分隔符号,
    return tokenlist_.push_back(std::shared_ptr<Token>(new Token(c)));
}